

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedlist.h
# Opt level: O0

void __thiscall
TWeightedList<FDecalBase_*>::AddEntry
          (TWeightedList<FDecalBase_*> *this,FDecalBase *value,WORD weight)

{
  bool bVar1;
  Choice<FDecalBase_*> *this_00;
  Choice<FDecalBase_*> *theNewOne;
  Choice<FDecalBase_*> *insBefore;
  Choice<FDecalBase_*> **insAfter;
  WORD weight_local;
  FDecalBase *value_local;
  TWeightedList<FDecalBase_*> *this_local;
  
  if (weight != 0) {
    theNewOne = this->Choices;
    insBefore = (Choice<FDecalBase_*> *)this;
    while( true ) {
      bVar1 = false;
      if (theNewOne != (Choice<FDecalBase_*> *)0x0) {
        bVar1 = theNewOne->Weight < weight;
      }
      if (!bVar1) break;
      insBefore = theNewOne;
      theNewOne = theNewOne->Next;
    }
    this_00 = (Choice<FDecalBase_*> *)operator_new(0x18);
    Choice<FDecalBase_*>::Choice(this_00,weight,value);
    insBefore->Next = this_00;
    this_00->Next = theNewOne;
    RecalcRandomVals(this);
  }
  return;
}

Assistant:

void TWeightedList<T>::AddEntry (T value, WORD weight)
{
	if (weight == 0)
	{ // If the weight is 0, don't bother adding it,
	  // since it will never be chosen.
		return;
	}

	Choice<T> **insAfter = &Choices, *insBefore = Choices;
	Choice<T> *theNewOne;

	while (insBefore != NULL && insBefore->Weight < weight)
	{
		insAfter = &insBefore->Next;
		insBefore = insBefore->Next;
	}
	theNewOne = new Choice<T> (weight, value);
	*insAfter = theNewOne;
	theNewOne->Next = insBefore;
	RecalcRandomVals ();
}